

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpath.cpp
# Opt level: O1

float __thiscall VPath::VPathData::length(VPathData *this)

{
  VPointF VVar1;
  VPointF VVar2;
  Element EVar3;
  pointer pEVar4;
  pointer pVVar5;
  ulong uVar6;
  long lVar7;
  pointer pEVar8;
  float fVar9;
  float fVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  VBezier local_50;
  
  if (this->mLengthDirty != false) {
    this->mLengthDirty = false;
    this->mLength = 0.0;
    pEVar8 = (this->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar4 = (this->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pEVar8 != pEVar4) {
      lVar7 = 0;
      do {
        EVar3 = *pEVar8;
        if (EVar3 == CubicTo) {
          pVVar5 = (this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                   super__Vector_impl_data._M_start;
          VBezier::fromPoints(pVVar5 + lVar7 + -1,pVVar5 + lVar7,pVVar5 + lVar7 + 1,
                              pVVar5 + lVar7 + 2);
          fVar9 = VBezier::length(&local_50);
          this->mLength = fVar9 + this->mLength;
          lVar7 = lVar7 + 3;
        }
        else {
          if (EVar3 == LineTo) {
            pVVar5 = (this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                     super__Vector_impl_data._M_start;
            VVar1 = pVVar5[lVar7 + -1];
            VVar2 = pVVar5[lVar7];
            auVar12._0_4_ = VVar2.mx - VVar1.mx;
            auVar12._4_4_ = VVar2.my - VVar1.my;
            auVar12._8_8_ = 0;
            uVar6 = CONCAT44(auVar12._4_4_,auVar12._0_4_);
            auVar10._0_8_ = uVar6 ^ 0x8000000080000000;
            auVar10._8_4_ = 0x80000000;
            auVar10._12_4_ = 0x80000000;
            auVar10 = maxps(auVar10,auVar12);
            fVar9 = auVar10._0_4_;
            fVar11 = auVar10._4_4_;
            this->mLength =
                 (float)(-(uint)(fVar11 < fVar9) & (uint)(fVar11 * 0.375 + fVar9) |
                        ~-(uint)(fVar11 < fVar9) & (uint)(fVar9 * 0.375 + fVar11)) + this->mLength;
          }
          else if (EVar3 != MoveTo) goto LAB_00112db8;
          lVar7 = lVar7 + 1;
        }
LAB_00112db8:
        pEVar8 = pEVar8 + 1;
      } while (pEVar8 != pEVar4);
    }
  }
  return this->mLength;
}

Assistant:

float VPath::VPathData::length() const
{
    if (!mLengthDirty) return mLength;

    mLengthDirty = false;
    mLength = 0.0;

    size_t i = 0;
    for (auto e : m_elements) {
        switch (e) {
        case VPath::Element::MoveTo:
            i++;
            break;
        case VPath::Element::LineTo: {
            mLength += VLine(m_points[i - 1], m_points[i]).length();
            i++;
            break;
        }
        case VPath::Element::CubicTo: {
            mLength += VBezier::fromPoints(m_points[i - 1], m_points[i],
                                           m_points[i + 1], m_points[i + 2])
                           .length();
            i += 3;
            break;
        }
        case VPath::Element::Close:
            break;
        }
    }

    return mLength;
}